

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_3650dd::HandleMakeDirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  reference b;
  bool bVar1;
  size_type sVar2;
  cmMakefile *pcVar3;
  string *a;
  string local_150;
  undefined1 local_130 [8];
  string error;
  Status mkdirStatus;
  undefined1 local_e0 [8];
  string e;
  string local_b8;
  reference local_98;
  string *cdir;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_68;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_48;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  string expr;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  expr.field_2._8_8_ = status;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFileCommand.cxx"
                  ,0x369,
                  "bool (anonymous namespace)::HandleMakeDirectoryCommand(const std::vector<std::string> &, cmExecutionStatus &)"
                 );
  }
  std::__cxx11::string::string((string *)&__range1);
  local_68 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       (args);
  local_58 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::advance(&local_68,1);
  local_48 = &local_58;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(local_48);
  arg = (string *)
        cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::end(local_48);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar1) {
      args_local._7_1_ = true;
      mkdirStatus.Kind_ = POSIX;
LAB_002f35af:
      std::__cxx11::string::~string((string *)&__range1);
      return args_local._7_1_;
    }
    local_98 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    cdir = local_98;
    bVar1 = cmsys::SystemTools::FileIsFullPath(local_98);
    if (!bVar1) {
      pcVar3 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)expr.field_2._8_8_);
      a = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar3);
      e.field_2._M_local_buf[0xf] = '/';
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                (&local_b8,a,e.field_2._M_local_buf + 0xf,cdir);
      std::__cxx11::string::operator=((string *)&__range1,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      local_98 = (reference)&__range1;
    }
    pcVar3 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)expr.field_2._8_8_);
    bVar1 = cmMakefile::CanIWriteThisFile(pcVar3,local_98);
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &mkdirStatus.field_1,"attempted to create a directory: ",local_98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &mkdirStatus.field_1," into a source directory.");
      std::__cxx11::string::~string((string *)&mkdirStatus.field_1);
      cmExecutionStatus::SetError((cmExecutionStatus *)expr.field_2._8_8_,(string *)local_e0);
      cmSystemTools::SetFatalErrorOccurred();
      args_local._7_1_ = false;
      mkdirStatus.Kind_ = POSIX;
      std::__cxx11::string::~string((string *)local_e0);
      goto LAB_002f35af;
    }
    register0x00000000 = cmsys::SystemTools::MakeDirectory(local_98,(mode_t *)0x0);
    bVar1 = cmsys::Status::operator_cast_to_bool((Status *)((long)&error.field_2 + 0xc));
    b = local_98;
    if (!bVar1) {
      cmsys::Status::GetString_abi_cxx11_(&local_150,(Status *)((long)&error.field_2 + 0xc));
      cmStrCat<char_const(&)[31],std::__cxx11::string_const&,char_const(&)[11],std::__cxx11::string>
                ((string *)local_130,(char (*) [31])"failed to create directory:\n  ",b,
                 (char (*) [11])"\nbecause: ",&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      cmExecutionStatus::SetError((cmExecutionStatus *)expr.field_2._8_8_,(string *)local_130);
      args_local._7_1_ = false;
      mkdirStatus.Kind_ = POSIX;
      std::__cxx11::string::~string((string *)local_130);
      goto LAB_002f35af;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool HandleMakeDirectoryCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  // File command has at least one argument
  assert(args.size() > 1);

  std::string expr;
  for (std::string const& arg :
       cmMakeRange(args).advance(1)) // Get rid of subcommand
  {
    const std::string* cdir = &arg;
    if (!cmsys::SystemTools::FileIsFullPath(arg)) {
      expr =
        cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', arg);
      cdir = &expr;
    }
    if (!status.GetMakefile().CanIWriteThisFile(*cdir)) {
      std::string e = "attempted to create a directory: " + *cdir +
        " into a source directory.";
      status.SetError(e);
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    cmsys::Status mkdirStatus = cmSystemTools::MakeDirectory(*cdir);
    if (!mkdirStatus) {
      std::string error = cmStrCat("failed to create directory:\n  ", *cdir,
                                   "\nbecause: ", mkdirStatus.GetString());
      status.SetError(error);
      return false;
    }
  }
  return true;
}